

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_move_16_aw_pcdi(void)

{
  uint value;
  uint uVar1;
  uint uVar2;
  
  value = OPER_PCDI_16();
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar2 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar2 = pmmu_translate_addr(uVar2);
  }
  uVar1 = m68k_read_memory_16(uVar2 & m68ki_cpu.address_mask);
  uVar2 = (uint)(short)uVar1;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar2 = pmmu_translate_addr(uVar2);
  }
  m68k_write_memory_16(uVar2 & m68ki_cpu.address_mask,value);
  m68ki_cpu.n_flag = value >> 8;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_move_16_aw_pcdi(void)
{
	uint res = OPER_PCDI_16();
	uint ea = EA_AW_16();

	m68ki_write_16(ea, res);

	FLAG_N = NFLAG_16(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}